

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void snap_restoredata(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,
                     IRRef ref,void *dst,CTSize sz)

{
  uint uVar1;
  SnapNo in_ECX;
  GCtrace *in_RDX;
  jit_State *in_RSI;
  ulong in_R8;
  uint in_R9D;
  void *unaff_retaddr;
  CTSize in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  Reg r;
  uint64_t tmp;
  int32_t *src;
  RegSP rs;
  IRIns *ir;
  IRIns local_50;
  IRIns *local_48;
  uint local_3c;
  IRIns *pIVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  local_48 = (in_RSI->cur).ir + in_R9D;
  local_3c = (uint)(local_48->field_0).prev;
  if (in_R9D < 0x8000) {
    if (((local_48->field_1).o == '\x1c') || ((local_48->field_1).o == '\x1d')) {
      local_48 = local_48 + 1;
    }
    else if (in_stack_00000010 == 8) {
      local_48 = &local_50;
    }
  }
  else {
    pIVar2 = local_48;
    if ((in_R8 & 1L << ((byte)in_R9D & 0x3f)) != 0) {
      local_3c = snap_renameref(&in_RSI->cur,in_ECX,in_R9D,local_3c);
      pIVar2 = local_48;
    }
    if (local_3c >> 8 == 0) {
      uVar1 = local_3c & 0xff;
      if ((local_3c & 0x80) != 0) {
        snap_restoredata(in_RSI,in_RDX,(ExitState *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                         (SnapNo)(in_R8 >> 0x20),CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                         (IRRef)((ulong)pIVar2 >> 0x20),unaff_retaddr,in_stack_00000008);
        *(double *)CONCAT44(in_stack_0000000c,in_stack_00000008) =
             (double)*(int *)CONCAT44(in_stack_0000000c,in_stack_00000008);
        return;
      }
      if (uVar1 < 0x10) {
        local_48 = (IRIns *)(&in_RDX[1].snap + uVar1);
      }
      else {
        local_48 = (IRIns *)(&in_RDX->nextgc + (ulong)(uVar1 - 0x10) * 2);
      }
    }
    else {
      local_48 = (IRIns *)((long)&in_RDX[2].mcode + (ulong)(local_3c >> 8) * 4);
      if ((in_stack_00000010 == 8) && ((0x604208U >> ((pIVar2->field_1).t.irt & 0x1f) & 1) == 0)) {
        local_48 = &local_50;
      }
    }
  }
  if (in_stack_00000010 == 4) {
    *(IRRef2 *)CONCAT44(in_stack_0000000c,in_stack_00000008) = (local_48->field_1).op12;
  }
  else if (in_stack_00000010 == 8) {
    ((IRIns *)CONCAT44(in_stack_0000000c,in_stack_00000008))->field_1 =
         *(anon_struct_8_5_4e98db7e_for_IRIns_2 *)local_48;
  }
  else if (in_stack_00000010 == 1) {
    *(char *)CONCAT44(in_stack_0000000c,in_stack_00000008) = (char)(local_48->field_1).op12;
  }
  else {
    *(short *)CONCAT44(in_stack_0000000c,in_stack_00000008) = (short)(local_48->field_1).op12;
  }
  return;
}

Assistant:

static void snap_restoredata(jit_State *J, GCtrace *T, ExitState *ex,
			     SnapNo snapno, BloomFilter rfilt,
			     IRRef ref, void *dst, CTSize sz)
{
  IRIns *ir = &T->ir[ref];
  RegSP rs = ir->prev;
  int32_t *src;
  uint64_t tmp;
  UNUSED(J);
  if (irref_isk(ref)) {
    if (ir_isk64(ir)) {
      src = (int32_t *)&ir[1];
    } else if (sz == 8) {
      tmp = (uint64_t)(uint32_t)ir->i;
      src = (int32_t *)&tmp;
    } else {
      src = &ir->i;
    }
  } else {
    if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
      rs = snap_renameref(T, snapno, ref, rs);
    if (ra_hasspill(regsp_spill(rs))) {
      src = &ex->spill[regsp_spill(rs)];
      if (sz == 8 && !irt_is64(ir->t)) {
	tmp = (uint64_t)(uint32_t)*src;
	src = (int32_t *)&tmp;
      }
    } else {
      Reg r = regsp_reg(rs);
      if (ra_noreg(r)) {
	/* Note: this assumes CNEWI is never used for SOFTFP split numbers. */
	lj_assertJ(sz == 8 && ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "restore from IR %04d has no reg", ref - REF_BIAS);
	snap_restoredata(J, T, ex, snapno, rfilt, ir->op1, dst, 4);
	*(lua_Number *)dst = (lua_Number)*(int32_t *)dst;
	return;
      }
#if !LJ_SOFTFP
      if (r >= RID_MAX_GPR) {
	src = (int32_t *)&ex->fpr[r-RID_MIN_FPR];
#if LJ_TARGET_PPC
	if (sz == 4) {  /* PPC FPRs are always doubles. */
	  *(float *)dst = (float)*(double *)src;
	  return;
	}
#else
	if (LJ_BE && sz == 4) src++;
#endif
      } else
#endif
      {
	src = (int32_t *)&ex->gpr[r-RID_MIN_GPR];
	if (LJ_64 && LJ_BE && sz == 4) src++;
      }
    }
  }
  lj_assertJ(sz == 1 || sz == 2 || sz == 4 || sz == 8,
	     "restore from IR %04d with bad size %d", ref - REF_BIAS, sz);
  if (sz == 4) *(int32_t *)dst = *src;
  else if (sz == 8) *(int64_t *)dst = *(int64_t *)src;
  else if (sz == 1) *(int8_t *)dst = (int8_t)*src;
  else *(int16_t *)dst = (int16_t)*src;
}